

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb_asnmth.c
# Opt level: O0

EVP_PKEY_ASN1_METHOD * ENGINE_get_pkey_asn1_meth(ENGINE *e,int nid)

{
  int iVar1;
  ENGINE_PKEY_ASN1_METHS_PTR pEVar2;
  ENGINE_PKEY_ASN1_METHS_PTR fn;
  EVP_PKEY_ASN1_METHOD *ret;
  EVP_PKEY_ASN1_METHOD *in_stack_ffffffffffffffe0;
  EVP_PKEY_ASN1_METHOD *local_8;
  
  pEVar2 = ENGINE_get_pkey_asn1_meths(e);
  if ((pEVar2 == (ENGINE_PKEY_ASN1_METHS_PTR)0x0) ||
     (iVar1 = (*pEVar2)(e,(EVP_PKEY_ASN1_METHOD **)&stack0xffffffffffffffe0,(int **)0x0,nid),
     local_8 = in_stack_ffffffffffffffe0, iVar1 == 0)) {
    ERR_new();
    ERR_set_debug((char *)e,nid,(char *)in_stack_ffffffffffffffe0);
    ERR_set_error(0x26,0x65,(char *)0x0);
    local_8 = (EVP_PKEY_ASN1_METHOD *)0x0;
  }
  return local_8;
}

Assistant:

const EVP_PKEY_ASN1_METHOD *ENGINE_get_pkey_asn1_meth(ENGINE *e, int nid)
{
    EVP_PKEY_ASN1_METHOD *ret;
    ENGINE_PKEY_ASN1_METHS_PTR fn = ENGINE_get_pkey_asn1_meths(e);
    if (!fn || !fn(e, &ret, NULL, nid)) {
        ERR_raise(ERR_LIB_ENGINE, ENGINE_R_UNIMPLEMENTED_PUBLIC_KEY_METHOD);
        return NULL;
    }
    return ret;
}